

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O2

void SynchFaceOrientation(ON_Brep *brep,int fi)

{
  int iVar1;
  ON_BrepFace *pOVar2;
  ON_BrepLoop *pOVar3;
  ON_BrepTrim *pOVar4;
  ON_BrepEdge *pOVar5;
  ON_BrepTrim *pOVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  
  pOVar2 = ON_Brep::Face(brep,fi);
  if (pOVar2 != (ON_BrepFace *)0x0) {
    iVar9 = -1;
    for (lVar8 = 0; lVar8 < (pOVar2->m_li).m_count; lVar8 = lVar8 + 1) {
      pOVar3 = ON_Brep::Loop(brep,(pOVar2->m_li).m_a[lVar8]);
      if (pOVar3 != (ON_BrepLoop *)0x0) {
        for (lVar7 = 0; lVar7 < (pOVar3->m_ti).m_count; lVar7 = lVar7 + 1) {
          pOVar4 = ON_Brep::Trim(brep,(pOVar3->m_ti).m_a[lVar7]);
          iVar1 = iVar9;
          if (((pOVar4 != (ON_BrepTrim *)0x0) &&
              (pOVar5 = ON_Brep::Edge(brep,pOVar4->m_ei), pOVar5 != (ON_BrepEdge *)0x0)) &&
             ((pOVar5->m_ti).m_count == 2)) {
            pOVar4 = ON_Brep::Trim(brep,*(pOVar5->m_ti).m_a);
            pOVar6 = ON_Brep::Trim(brep,(pOVar5->m_ti).m_a[1]);
            if (pOVar6 != (ON_BrepTrim *)0x0 && pOVar4 != (ON_BrepTrim *)0x0) {
              if (pOVar4->m_bRev3d == pOVar6->m_bRev3d) {
                iVar1 = 1;
                if ((iVar9 != -1) && (iVar9 != 1)) {
                  return;
                }
              }
              else {
                iVar1 = 0;
                if (1 < iVar9 + 1U) {
                  return;
                }
              }
            }
          }
          iVar9 = iVar1;
        }
      }
    }
    if (iVar9 == 1) {
      ON_Brep::FlipFace(brep,(brep->m_F).super_ON_ObjectArray<ON_BrepFace>.
                             super_ON_ClassArray<ON_BrepFace>.m_a + fi);
      return;
    }
  }
  return;
}

Assistant:

static
void SynchFaceOrientation( ON_Brep& brep, int fi )
{
  const ON_BrepFace* face = brep.Face(fi);
  if ( face )
  {
    int flip = -1, fli, lti;
    for ( fli = 0; fli < face->m_li.Count(); fli++ )
    {
      const ON_BrepLoop* loop = brep.Loop( face->m_li[fli] );
      if ( !loop )
        continue;
      for ( lti = 0; lti < loop->m_ti.Count(); lti++ )
      {
        const ON_BrepTrim* trim = brep.Trim( loop->m_ti[lti] );
        if ( !trim )
          continue;
        const ON_BrepEdge* edge = brep.Edge( trim->m_ei );
        if ( !edge )
          continue;
        if ( edge->m_ti.Count() != 2 )
          continue;
        const ON_BrepTrim* trim0 = brep.Trim( edge->m_ti[0] );
        const ON_BrepTrim* trim1 = brep.Trim( edge->m_ti[1] );
        if ( !trim0 || !trim1 )
          continue;
        bool bRev0 = trim0->m_bRev3d ? true : false;
        bool bRev1 = trim1->m_bRev3d ? true : false;
        if ( bRev0 == bRev1 )
        {
          if ( flip == -1 )
            flip = 1;
          else if (flip != 1 )
            return;
        }
        else
        {
          if ( flip == -1 )
            flip = 0;
          else if (flip != 0 )
            return;
        }
      }
    }
    if ( flip == 1 )
      brep.FlipFace(brep.m_F[fi]);
  }
}